

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void CompressTables(lemon *lemp)

{
  state *psVar1;
  rule *prVar2;
  symbol *psVar3;
  action *paVar4;
  bool bVar5;
  state *pNextState;
  int usesWildcard;
  int i;
  int n;
  int nbest;
  rule *rbest;
  rule *rp2;
  rule *rp;
  action *nextap;
  action *ap2;
  action *ap;
  state *stp;
  lemon *lemp_local;
  
  pNextState._4_4_ = 0;
  do {
    if (lemp->nstate <= pNextState._4_4_) {
      for (pNextState._4_4_ = 0; pNextState._4_4_ < lemp->nstate;
          pNextState._4_4_ = pNextState._4_4_ + 1) {
        for (ap2 = lemp->sorted[pNextState._4_4_]->ap; ap2 != (action *)0x0; ap2 = ap2->next) {
          if (((ap2->type == SHIFT) && (psVar1 = (ap2->x).stp, psVar1->autoReduce != 0)) &&
             (psVar1->pDfltReduce != (rule *)0x0)) {
            ap2->type = SHIFTREDUCE;
            ap2->x = (anon_union_8_2_743af1f4_for_x)psVar1->pDfltReduce;
          }
        }
      }
      pNextState._4_4_ = 0;
      do {
        if (lemp->nstate <= pNextState._4_4_) {
          return;
        }
        psVar1 = lemp->sorted[pNextState._4_4_];
        ap2 = psVar1->ap;
        while (ap2 != (action *)0x0) {
          rp = (rule *)ap2->next;
          if (((ap2->type == SHIFTREDUCE) && (prVar2 = (ap2->x).rp, prVar2->noCode != 0)) &&
             ((prVar2->nrhs == 1 && (lemp->nterminal <= ap2->sp->index)))) {
            rp = (rule *)ap2;
            nextap = psVar1->ap;
            while( true ) {
              bVar5 = false;
              if ((nextap != (action *)0x0) && (bVar5 = true, nextap != ap2)) {
                bVar5 = nextap->sp != prVar2->lhs;
              }
              if (!bVar5) break;
              nextap = nextap->next;
            }
            if (nextap == (action *)0x0) {
              __assert_fail("ap2!=0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                            ,0x122c,"void CompressTables(struct lemon *)");
            }
            ap2->spOpt = nextap->sp;
            ap2->type = nextap->type;
            ap2->x = nextap->x;
          }
          ap2 = (action *)rp;
        }
        pNextState._4_4_ = pNextState._4_4_ + 1;
      } while( true );
    }
    psVar1 = lemp->sorted[pNextState._4_4_];
    i = 0;
    _n = (rule *)0x0;
    bVar5 = false;
    for (ap2 = psVar1->ap; ap2 != (action *)0x0; ap2 = ap2->next) {
      if ((ap2->type == SHIFT) && (ap2->sp == lemp->wildcard)) {
        bVar5 = true;
      }
      if (((ap2->type == REDUCE) && (prVar2 = (rule *)(ap2->x).stp, prVar2->lhsStart == 0)) &&
         (prVar2 != _n)) {
        usesWildcard = 1;
        for (nextap = ap2->next; nextap != (action *)0x0; nextap = nextap->next) {
          if (((nextap->type == REDUCE) && ((rule *)(nextap->x).stp != _n)) &&
             ((rule *)(nextap->x).stp == prVar2)) {
            usesWildcard = usesWildcard + 1;
          }
        }
        if (i < usesWildcard) {
          i = usesWildcard;
          _n = prVar2;
        }
      }
    }
    if ((0 < i) && (!bVar5)) {
      for (ap2 = psVar1->ap;
          (ap2 != (action *)0x0 && ((ap2->type != REDUCE || ((rule *)(ap2->x).stp != _n))));
          ap2 = ap2->next) {
      }
      if (ap2 == (action *)0x0) {
        __assert_fail("ap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0x11f3,"void CompressTables(struct lemon *)");
      }
      psVar3 = Symbol_new("{default}");
      ap2->sp = psVar3;
      for (ap2 = ap2->next; ap2 != (action *)0x0; ap2 = ap2->next) {
        if ((ap2->type == REDUCE) && ((rule *)(ap2->x).stp == _n)) {
          ap2->type = NOT_USED;
        }
      }
      paVar4 = Action_sort(psVar1->ap);
      psVar1->ap = paVar4;
      for (ap2 = psVar1->ap;
          ((ap2 != (action *)0x0 && (ap2->type != SHIFT)) &&
          ((ap2->type != REDUCE || ((rule *)(ap2->x).stp == _n)))); ap2 = ap2->next) {
      }
      if (ap2 == (action *)0x0) {
        psVar1->autoReduce = 1;
        psVar1->pDfltReduce = _n;
      }
    }
    pNextState._4_4_ = pNextState._4_4_ + 1;
  } while( true );
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2, *nextap;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }

    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possbile
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT ) break;
      if( ap->type==REDUCE && ap->x.rp!=rbest ) break;
    }
    if( ap==0 ){
      stp->autoReduce = 1;
      stp->pDfltReduce = rbest;
    }
  }

  /* Make a second pass over all states and actions.  Convert
  ** every action that is a SHIFT to an autoReduce state into
  ** a SHIFTREDUCE action.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=ap->next){
      struct state *pNextState;
      if( ap->type!=SHIFT ) continue;
      pNextState = ap->x.stp;
      if( pNextState->autoReduce && pNextState->pDfltReduce!=0 ){
        ap->type = SHIFTREDUCE;
        ap->x.rp = pNextState->pDfltReduce;
      }
    }
  }

  /* If a SHIFTREDUCE action specifies a rule that has a single RHS term
  ** (meaning that the SHIFTREDUCE will land back in the state where it
  ** started) and if there is no C-code associated with the reduce action,
  ** then we can go ahead and convert the action to be the same as the
  ** action for the RHS of the rule.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=nextap){
      nextap = ap->next;
      if( ap->type!=SHIFTREDUCE ) continue;
      rp = ap->x.rp;
      if( rp->noCode==0 ) continue;
      if( rp->nrhs!=1 ) continue;
#if 1
      /* Only apply this optimization to non-terminals.  It would be OK to
      ** apply it to terminal symbols too, but that makes the parser tables
      ** larger. */
      if( ap->sp->index<lemp->nterminal ) continue;
#endif
      /* If we reach this point, it means the optimization can be applied */
      nextap = ap;
      for(ap2=stp->ap; ap2 && (ap2==ap || ap2->sp!=rp->lhs); ap2=ap2->next){}
      assert( ap2!=0 );
      ap->spOpt = ap2->sp;
      ap->type = ap2->type;
      ap->x = ap2->x;
    }
  }
}